

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.c
# Opt level: O2

int sais_int_bwt(int *T,int *U,int *A,int n,int k)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (k < 1 || ((n < 0 || A == (int *)0x0) || (U == (int *)0x0 || T == (int *)0x0))) {
    uVar1 = 0xffffffff;
  }
  else if ((uint)n < 2) {
    uVar1 = 0;
    if (n == 1) {
      *U = *T;
      uVar1 = 1;
    }
  }
  else {
    uVar1 = sais_main(T,A,(int *)0x0,0,n,k,4,1,1);
    if (-1 < (int)uVar1) {
      *U = T[(ulong)(uint)n - 1];
      uVar2 = (ulong)uVar1;
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        U[uVar3 + 1] = A[uVar3];
      }
      while (uVar2 = uVar2 + 1, uVar2 < (uint)n) {
        U[uVar2] = A[uVar2];
      }
      uVar1 = uVar1 + 1;
    }
  }
  return uVar1;
}

Assistant:

int
sais_int_bwt(const int *T, int *U, int *A, int n, int k) {
  int i, pidx;
  if((T == NULL) || (U == NULL) || (A == NULL) || (n < 0) || (k <= 0)) { return -1; }
  if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }
  pidx = sais_main(T, A, NULL, 0, n, k, sizeof(int), 1,1);
  if(pidx < 0) { return pidx; }
  U[0] = T[n - 1];
  for(i = 0; i < pidx; ++i) { U[i + 1] = A[i]; }
  for(i += 1; i < n; ++i) { U[i] = A[i]; }
  pidx += 1;
  return pidx;
}